

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymTable.cpp
# Opt level: O0

PropertySym * __thiscall SymTable::FindPropertySym(SymTable *this,SymID stackSymID,int32 propertyId)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  undefined1 local_34 [8];
  SymIdPropIdPair pair;
  PropertySym *propertySym;
  int32 propertyId_local;
  SymID stackSymID_local;
  SymTable *this_local;
  
  pair.second = 0;
  pair.initialized = false;
  pair._9_3_ = 0;
  propertySym._4_4_ = this->m_IDAdjustment + stackSymID;
  propertySym._0_4_ = propertyId;
  _propertyId_local = this;
  JsUtil::Pair<unsigned_int,_int,_DefaultComparer>::Pair
            ((Pair<unsigned_int,_int,_DefaultComparer> *)local_34,(uint *)((long)&propertySym + 4),
             (int *)&propertySym);
  bVar2 = JsUtil::
          BaseDictionary<JsUtil::Pair<unsigned_int,int,DefaultComparer>,PropertySym*,Memory::JitArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetValue<JsUtil::Pair<unsigned_int,int,DefaultComparer>>
                    ((BaseDictionary<JsUtil::Pair<unsigned_int,int,DefaultComparer>,PropertySym*,Memory::JitArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this->m_propertyMap,(Pair<unsigned_int,_int,_DefaultComparer> *)local_34,
                     (PropertySym **)&pair.second);
  if (bVar2) {
    if (*(int *)(pair._4_8_ + 0x18) != (int32)propertySym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SymTable.cpp"
                         ,0xab,"(propertySym->m_propertyId == propertyId)",
                         "propertySym->m_propertyId == propertyId");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    if (*(int *)(*(long *)(pair._4_8_ + 0x20) + 0x10) != propertySym._4_4_) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/SymTable.cpp"
                         ,0xac,"(propertySym->m_stackSym->m_id == stackSymID)",
                         "propertySym->m_stackSym->m_id == stackSymID");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    this_local = (SymTable *)pair._4_8_;
  }
  else {
    this_local = (SymTable *)0x0;
  }
  return (PropertySym *)this_local;
}

Assistant:

PropertySym *
SymTable::FindPropertySym(SymID stackSymID, int32 propertyId) const
{
    PropertySym *  propertySym = nullptr;

    stackSymID += this->m_IDAdjustment;

    SymIdPropIdPair pair(stackSymID, propertyId);
    if (this->m_propertyMap->TryGetValue(pair, &propertySym))
    {
        Assert(propertySym->m_propertyId == propertyId);
        Assert(propertySym->m_stackSym->m_id == stackSymID);

        return propertySym;
    }
    return NULL;
}